

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

ExprBase * AnalyzeString(ExpressionContext *ctx,SynString *syntax)

{
  char *pcVar1;
  uchar uVar2;
  uint uVar3;
  int iVar4;
  undefined4 extraout_var;
  ExprStringLiteral *this;
  TypeArray *type;
  uint local_64;
  char *end_1;
  char *curr_1;
  uint local_48;
  uint i_2;
  uint i_1;
  uint i;
  char *value;
  uint memory;
  char *end;
  char *curr;
  uint length;
  SynString *syntax_local;
  ExpressionContext *ctx_local;
  char *pcVar5;
  
  curr._4_4_ = 0;
  if (((syntax->super_SynBase).field_0x3a & 1) == 0) {
    pcVar5 = (syntax->value).begin;
    while (end = pcVar5 + 1, end < (syntax->value).end + -1) {
      if (*end == '\\') {
        end = pcVar5 + 2;
      }
      curr._4_4_ = curr._4_4_ + 1;
      pcVar5 = end;
    }
  }
  else {
    uVar3 = InplaceStr::length(&syntax->value);
    if (1 < uVar3) {
      uVar3 = InplaceStr::length(&syntax->value);
      curr._4_4_ = uVar3 - 2;
    }
  }
  if (curr._4_4_ == 0) {
    local_64 = 4;
  }
  else {
    local_64 = curr._4_4_ + 4 & 0xfffffffc;
  }
  iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,(ulong)local_64);
  pcVar5 = (char *)CONCAT44(extraout_var,iVar4);
  for (i_2 = curr._4_4_; i_2 < local_64; i_2 = i_2 + 1) {
    pcVar5[i_2] = '\0';
  }
  if (((syntax->super_SynBase).field_0x3a & 1) == 0) {
    curr_1._4_4_ = 0;
    end_1 = (syntax->value).begin + 1;
    pcVar1 = (syntax->value).end;
    while (end_1 < pcVar1 + -1) {
      if (*end_1 == '\\') {
        uVar2 = anon_unknown.dwarf_8df1c::ParseEscapeSequence(ctx,&syntax->super_SynBase,end_1);
        pcVar5[curr_1._4_4_] = uVar2;
        end_1 = end_1 + 2;
      }
      else {
        pcVar5[curr_1._4_4_] = *end_1;
        end_1 = end_1 + 1;
      }
      curr_1._4_4_ = curr_1._4_4_ + 1;
    }
    pcVar5[curr._4_4_] = '\0';
  }
  else {
    for (local_48 = 0; local_48 < curr._4_4_; local_48 = local_48 + 1) {
      pcVar5[local_48] = (syntax->value).begin[local_48 + 1];
    }
    pcVar5[curr._4_4_] = '\0';
  }
  this = ExpressionContext::get<ExprStringLiteral>(ctx);
  type = ExpressionContext::GetArrayType(ctx,ctx->typeChar,(ulong)(curr._4_4_ + 1));
  ExprStringLiteral::ExprStringLiteral
            (this,&syntax->super_SynBase,&type->super_TypeBase,pcVar5,curr._4_4_);
  return &this->super_ExprBase;
}

Assistant:

ExprBase* AnalyzeString(ExpressionContext &ctx, SynString *syntax)
{
	unsigned length = 0;

	if(syntax->rawLiteral)
	{
		if(syntax->value.length() >= 2)
			length = syntax->value.length() - 2;
	}
	else
	{
		// Find the length of the string with collapsed escape-sequences
		for(const char *curr = syntax->value.begin + 1, *end = syntax->value.end - 1; curr < end; curr++, length++)
		{
			if(*curr == '\\')
				curr++;
		}
	}

	unsigned memory = length ? ((length + 1) + 3) & ~3 : 4;

	char *value = (char*)ctx.allocator->alloc(memory);

	for(unsigned i = length; i < memory; i++)
		value[i] = 0;

	if(syntax->rawLiteral)
	{
		for(unsigned i = 0; i < length; i++)
			value[i] = syntax->value.begin[i + 1];

		value[length] = 0;
	}
	else
	{
		unsigned i = 0;

		// Find the length of the string with collapsed escape-sequences
		for(const char *curr = syntax->value.begin + 1, *end = syntax->value.end - 1; curr < end;)
		{
			if(*curr == '\\')
			{
				value[i++] = ParseEscapeSequence(ctx, syntax, curr);
				curr += 2;
			}
			else
			{
				value[i++] = *curr;
				curr += 1;
			}
		}

		value[length] = 0;
	}

	return new (ctx.get<ExprStringLiteral>()) ExprStringLiteral(syntax, ctx.GetArrayType(ctx.typeChar, length + 1), value, length);
}